

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::TestDeferredTestReporterFixtureReportFailureSavesFailureDetails::RunImpl
          (TestDeferredTestReporterFixtureReportFailureSavesFailureDetails *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_c8 [8];
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper fixtureHelper;
  bool ctorOk;
  TestDeferredTestReporterFixtureReportFailureSavesFailureDetails *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper::
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper *)local_c8,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper>
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper *)local_c8,
             &(this->super_Test).m_details);
  DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper::
  ~DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper
            ((DeferredTestReporterFixtureReportFailureSavesFailureDetailsHelper *)local_c8);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, ReportFailureSavesFailureDetails)
{
    char const* failure = "failure";

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, failure);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    CHECK(result.failed == true);
    CHECK_EQUAL(fileName.c_str(), result.failureFile);
}